

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldRef.c
# Opt level: O0

Vec_Int_t * Gia_ManFlops2Classes(Gia_Man_t *pGia,Vec_Int_t *vFlops)

{
  int iVar1;
  Vec_Int_t *p;
  undefined4 local_24;
  int Entry;
  int i;
  Vec_Int_t *vFlopClasses;
  Vec_Int_t *vFlops_local;
  Gia_Man_t *pGia_local;
  
  iVar1 = Gia_ManRegNum(pGia);
  p = Vec_IntStart(iVar1);
  for (local_24 = 0; iVar1 = Vec_IntSize(vFlops), local_24 < iVar1; local_24 = local_24 + 1) {
    iVar1 = Vec_IntEntry(vFlops,local_24);
    Vec_IntWriteEntry(p,iVar1,1);
  }
  return p;
}

Assistant:

Vec_Int_t * Gia_ManFlops2Classes( Gia_Man_t * pGia, Vec_Int_t * vFlops )
{
    Vec_Int_t * vFlopClasses;
    int i, Entry;
    vFlopClasses = Vec_IntStart( Gia_ManRegNum(pGia) );
    Vec_IntForEachEntry( vFlops, Entry, i )
        Vec_IntWriteEntry( vFlopClasses, Entry, 1 );
    return vFlopClasses;
}